

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

uint dumpParentChain(DWARFDie Die,raw_ostream *OS,uint Indent,DIDumpOptions DumpOpts,uint Depth)

{
  bool bVar1;
  uint Indent_00;
  DWARFDie Die_00;
  uint Depth_local;
  uint Indent_local;
  raw_ostream *OS_local;
  DWARFDie Die_local;
  
  Die_local.U = (DWARFUnit *)Die.Die;
  OS_local = (raw_ostream *)Die.U;
  bVar1 = llvm::DWARFDie::operator_cast_to_bool((DWARFDie *)&OS_local);
  Die_local.Die._4_4_ = Indent;
  if ((bVar1) && ((DumpOpts.ParentRecurseDepth == 0 || (Depth < DumpOpts.ParentRecurseDepth)))) {
    Die_00 = llvm::DWARFDie::getParent((DWARFDie *)&OS_local);
    Indent_00 = dumpParentChain(Die_00,OS,Indent,DumpOpts,Depth + 1);
    llvm::DWARFDie::dump((DWARFDie *)&OS_local,OS,Indent_00,DumpOpts);
    Die_local.Die._4_4_ = Indent_00 + 2;
  }
  return Die_local.Die._4_4_;
}

Assistant:

static unsigned dumpParentChain(DWARFDie Die, raw_ostream &OS, unsigned Indent,
                                DIDumpOptions DumpOpts, unsigned Depth = 0) {
  if (!Die)
    return Indent;
  if (DumpOpts.ParentRecurseDepth > 0 && Depth >= DumpOpts.ParentRecurseDepth)
    return Indent;
  Indent = dumpParentChain(Die.getParent(), OS, Indent, DumpOpts, Depth + 1);
  Die.dump(OS, Indent, DumpOpts);
  return Indent + 2;
}